

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  GroupNode *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *in_RDX;
  long in_RSI;
  Node *in_RDI;
  Ref<embree::XML> *in_stack_00000098;
  XMLLoader *in_stack_000000a0;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t id;
  char *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  size_t in_stack_fffffffffffffd68;
  key_type *in_stack_fffffffffffffd88;
  map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *in_stack_fffffffffffffd90;
  ParseLocation *in_stack_fffffffffffffdf8;
  Ref<embree::XML> *in_stack_fffffffffffffe50;
  XMLLoader *in_stack_fffffffffffffe58;
  string local_188 [32];
  MaterialNode *in_stack_fffffffffffffe98;
  XMLLoader *in_stack_fffffffffffffea0;
  long *local_158 [3];
  Node *local_140;
  long local_138;
  undefined8 *local_130;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  GroupNode *local_e0;
  undefined8 *local_d0;
  Ref<embree::XML> *in_stack_ffffffffffffff38;
  XMLLoader *in_stack_ffffffffffffff40;
  long **pplVar4;
  
  local_138 = *(long *)(in_RSI + 0x58);
  *(long *)(in_RSI + 0x58) = local_138 + 1;
  local_130 = in_RDX;
  bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  if (bVar1) {
    loadBGFMesh(in_stack_000000a0,in_stack_00000098);
    pmVar2 = std::
             map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    if (pmVar2->ptr != (Node *)0x0) {
      (*(pmVar2->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar2->ptr = local_140;
    local_140 = (Node *)0x0;
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar2->ptr;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    if (local_140 != (Node *)0x0) {
      (**(code **)(*(long *)local_140 + 0x18))();
    }
  }
  else {
    local_f0 = local_130;
    bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    if (bVar1) {
      loadBGFGroupNode(in_stack_fffffffffffffea0,(Ref<embree::XML> *)in_stack_fffffffffffffe98);
      pmVar2 = std::
               map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      pplVar4 = local_158;
      if (pmVar2->ptr != (Node *)0x0) {
        (*(pmVar2->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar2->ptr = (Node *)*pplVar4;
      *pplVar4 = (long *)0x0;
      (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar2->ptr;
      if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
      }
      if (local_158[0] != (long *)0x0) {
        (**(code **)(*local_158[0] + 0x18))();
      }
    }
    else {
      local_f8 = local_130;
      bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      if (bVar1) {
        loadBGFTransformNode(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        pmVar2 = std::
                 map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        local_d0 = (undefined8 *)&stack0xfffffffffffffea0;
        if (pmVar2->ptr != (Node *)0x0) {
          (*(pmVar2->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        pmVar2->ptr = (Node *)*local_d0;
        *local_d0 = 0;
        (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pmVar2->ptr;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
        if (in_stack_fffffffffffffea0 != (XMLLoader *)0x0) {
          (**(code **)(*(long *)&(in_stack_fffffffffffffea0->path).filename + 0x18))();
        }
      }
      else {
        local_100 = local_130;
        bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        if (bVar1) {
          loadBGFMaterial(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          pmVar3 = std::
                   map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                   ::operator[](in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          if (in_stack_fffffffffffffe98 != (MaterialNode *)0x0) {
            (*(in_stack_fffffffffffffe98->super_Node).super_RefCount._vptr_RefCount[2])();
          }
          if (pmVar3->ptr != (MaterialNode *)0x0) {
            (*(pmVar3->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          pmVar3->ptr = in_stack_fffffffffffffe98;
          (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)in_stack_fffffffffffffe98;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
          if (in_stack_fffffffffffffe98 != (MaterialNode *)0x0) {
            (*(in_stack_fffffffffffffe98->super_Node).super_RefCount._vptr_RefCount[3])();
          }
        }
        else {
          local_108 = local_130;
          bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          if (!bVar1) {
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x10);
            local_110 = local_130;
            ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffdf8);
            std::operator+(__lhs,(char *)in_stack_fffffffffffffd50);
            local_118 = local_130;
            std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)*local_130);
            std::runtime_error::runtime_error((runtime_error *)__lhs,local_188);
            __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this_00 = (GroupNode *)::operator_new(0x80);
          SceneGraph::GroupNode::GroupNode(this_00,in_stack_fffffffffffffd68);
          (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            local_e0 = this_00;
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
        }
      }
    }
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFNode(const Ref<XML>& xml)
  {
    //const size_t id = atoi(xml->parm("id").c_str());
    const size_t id = currentNodeID++;

    if      (xml->name == "Mesh"     ) return id2node[id] = loadBGFMesh(xml);
    else if (xml->name == "Group"    ) return id2node[id] = loadBGFGroupNode(xml);
    else if (xml->name == "Transform") return id2node[id] = loadBGFTransformNode(xml);
    else if (xml->name == "Material" ) 
    {
      Ref<SceneGraph::MaterialNode> material = loadBGFMaterial(xml); 
      id2material[id] = material;
      return material.cast<SceneGraph::Node>();
    }
    else if (xml->name == "Texture2D") {
      // textures not implemented yet
      return new SceneGraph::GroupNode();
    }
    else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);
  }